

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O0

Aig_Man_t * Fra_FramesWithClasses(Fra_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int local_44;
  int local_40;
  int f;
  int k;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pManFraig;
  Fra_Man_t *p_local;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x87,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  iVar1 = Aig_ManRegNum(p->pManAig);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p->pManAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x88,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  iVar1 = Aig_ManRegNum(p->pManAig);
  iVar2 = Aig_ManCiNum(p->pManAig);
  if (iVar2 <= iVar1) {
    __assert_fail("Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                  ,0x89,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  p_00 = Aig_ManStart(iVar1 * p->nFramesAll);
  pcVar3 = Abc_UtilStrsav(p->pManAig->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pManAig->pSpec);
  p_00->pSpec = pcVar3;
  p_00->nRegs = p->pManAig->nRegs;
  for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
    pAVar4 = Aig_ManConst1(p->pManAig);
    pAVar5 = Aig_ManConst1(p_00);
    Fra_ObjSetFraig(pAVar4,local_44,pAVar5);
  }
  for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
    f = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(p->pManAig);
      iVar2 = Aig_ManRegNum(p->pManAig);
      if (iVar1 - iVar2 <= f) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,f);
      pAVar5 = Aig_ObjCreateCi(p_00);
      Fra_ObjSetFraig(pAVar4,local_44,pAVar5);
      f = f + 1;
    }
  }
  iVar1 = Aig_ManCiNum(p->pManAig);
  iVar2 = Aig_ManRegNum(p->pManAig);
  for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pManAig->vCis), f < iVar1; f = f + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,f);
    pAVar5 = Aig_ObjCreateCi(p_00);
    Fra_ObjSetFraig(pAVar4,0,pAVar5);
  }
  for (local_44 = 0; local_44 < p->nFramesAll + -1; local_44 = local_44 + 1) {
    iVar1 = Aig_ManCiNum(p->pManAig);
    iVar2 = Aig_ManRegNum(p->pManAig);
    for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pManAig->vCis), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,f);
      Fra_FramesConstrainNode(p_00,pAVar4,local_44);
    }
    for (f = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,f);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Fra_ObjChild0Fra(pAVar4,local_44);
        p1 = Fra_ObjChild1Fra(pAVar4,local_44);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        Fra_ObjSetFraig(pAVar4,local_44,pAVar5);
        Fra_FramesConstrainNode(p_00,pAVar4,local_44);
      }
    }
    for (local_40 = 0; iVar1 = Aig_ManRegNum(p->pManAig), local_40 < iVar1; local_40 = local_40 + 1)
    {
      pAVar4 = Aig_ManLi(p->pManAig,local_40);
      pAVar5 = Aig_ManLo(p->pManAig,local_40);
      pAVar4 = Fra_ObjChild0Fra(pAVar4,local_44);
      Fra_ObjSetFraig(pAVar5,local_44 + 1,pAVar4);
    }
  }
  iVar1 = Aig_ManCoNum(p_00);
  p_00->nAsserts = iVar1;
  iVar1 = Aig_ManCiNum(p->pManAig);
  iVar2 = Aig_ManRegNum(p->pManAig);
  for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pManAig->vCis), f < iVar1; f = f + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCis,f);
    pAVar4 = Fra_ObjFraig(pAVar4,p->nFramesAll + -1);
    Aig_ObjCreateCo(p_00,pAVar4);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraInd.c"
                ,0xb6,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_FramesWithClasses( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, k, f;
    assert( p->pManFraig == NULL );
    assert( Aig_ManRegNum(p->pManAig) > 0 );
    assert( Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig) );

    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) * p->nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs = p->pManAig->nRegs;
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), f, Aig_ManConst1(pManFraig) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pManAig, pObj, i )
            Fra_ObjSetFraig( pObj, f, Aig_ObjCreateCi(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );

    // add timeframes
//    pManFraig->fAddStrash = 1;
    for ( f = 0; f < p->nFramesAll - 1; f++ )
    {
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pManAig, pObj, i )
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pManAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Fra(pObj,f), Fra_ObjChild1Fra(pObj,f) );
            Fra_ObjSetFraig( pObj, f, pObjNew );
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        }
        // transfer latch input to the latch outputs 
        Aig_ManForEachLiLoSeq( p->pManAig, pObjLi, pObjLo, k )
            Fra_ObjSetFraig( pObjLo, f+1, Fra_ObjChild0Fra(pObjLi,f) );
    }
//    pManFraig->fAddStrash = 0;
    // mark the asserts
    pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
    // add the POs for the latch outputs of the last frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Aig_ObjCreateCo( pManFraig, Fra_ObjFraig(pObj,p->nFramesAll-1) );

    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}